

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::ClassNamePrefix
                   (string *__return_storage_ptr__,string *classname)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  string lower;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  pcVar1 = (classname->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + classname->_M_string_length);
  puVar2 = local_48;
  if (local_40 != 0) {
    lVar4 = 0;
    do {
      iVar3 = tolower((int)(char)puVar2[lVar4]);
      puVar2[lVar4] = (char)iVar3;
      lVar4 = lVar4 + 1;
    } while (local_40 != lVar4);
  }
  lVar4 = 0;
  do {
    iVar3 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar3 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"PB","");
      goto LAB_00265dce;
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x248);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_00265dce:
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNamePrefix(const string& classname) {
  string lower = classname;
  transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      return "PB";
    }
  }

  return "";
}